

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemTreeView.cpp
# Opt level: O0

QStringList * __thiscall QFileSystemTreeView::selection(QFileSystemTreeView *this)

{
  bool bVar1;
  QModelIndex *this_00;
  QStringList *in_RDI;
  QModelIndex *index;
  QForeachContainer<QList<QModelIndex>_> _container_219;
  QModelIndexList indexes;
  QStringList *selection;
  rvalue_ref in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  QFileInfo local_a0 [32];
  QModelIndex *local_80;
  QModelIndex *local_78;
  const_iterator local_48;
  const_iterator local_40;
  undefined1 local_29;
  undefined1 local_28 [40];
  
  QAbstractItemView::selectionModel();
  QItemSelectionModel::selectedRows((int)local_28);
  local_29 = 0;
  QList<QString>::QList((QList<QString> *)0x22be7f);
  QtPrivate::qMakeForeachContainer<QList<QModelIndex>const&>
            ((QList<QModelIndex> *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  while( true ) {
    local_78 = local_40.i;
    bVar1 = QList<QModelIndex>::const_iterator::operator!=(&local_48,local_40);
    if (!bVar1) break;
    this_00 = QList<QModelIndex>::const_iterator::operator*(&local_48);
    local_80 = this_00;
    QFileSystemModel::fileInfo((QModelIndex *)local_a0);
    QFileInfo::absoluteFilePath();
    QList<QString>::operator<<((QList<QString> *)this_00,in_stack_ffffffffffffff28);
    QString::~QString((QString *)0x22bf5e);
    QFileInfo::~QFileInfo(local_a0);
    QList<QModelIndex>::const_iterator::operator++(&local_48);
  }
  QtPrivate::QForeachContainer<QList<QModelIndex>_>::~QForeachContainer
            ((QForeachContainer<QList<QModelIndex>_> *)0x22becb);
  local_29 = 1;
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x22bfe3);
  return in_RDI;
}

Assistant:

QStringList QFileSystemTreeView::selection() const {
    const QModelIndexList indexes = selectionModel()->selectedRows();
    QStringList selection;

    foreach (const QModelIndex &index, indexes) {
        selection << d->model->fileInfo(index).absoluteFilePath();
    }

    return selection;
}